

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_Serialize(ktxHashList *pHead,uint *pKvdLen,uchar **ppKvd)

{
  ktxHashList pkVar1;
  uint in_EAX;
  void **ppvVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  size_t __n;
  ktx_error_code_e kVar6;
  uchar *puVar7;
  float fVar8;
  undefined1 in_XMM0 [16];
  undefined1 auVar9 [16];
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uStack_38;
  char padding [4];
  
  if (ppKvd == (uchar **)0x0 || (pKvdLen == (uint *)0x0 || pHead == (ktxHashList *)0x0)) {
    kVar6 = KTX_INVALID_VALUE;
  }
  else {
    uStack_38 = (ulong)in_EAX;
    uVar5 = 0;
    ppvVar2 = pHead;
    while (pkVar1 = (ktxHashList)*ppvVar2, pkVar1 != (ktxHashList)0x0) {
      auVar9._4_12_ = in_XMM0._4_12_;
      auVar9._0_4_ = (float)(pkVar1->keyLen + pkVar1->valueLen + 4) * 0.25;
      auVar9 = roundss(auVar9,auVar9,10);
      in_XMM0._4_12_ = auVar9._4_12_;
      in_XMM0._0_4_ = auVar9._0_4_ * 4.0;
      uVar5 = uVar5 + (int)(long)in_XMM0._0_4_;
      ppvVar2 = &(pkVar1->hh).next;
    }
    if (uVar5 == 0) {
      *pKvdLen = 0;
      *ppKvd = (uchar *)0x0;
      kVar6 = KTX_SUCCESS;
    }
    else {
      puVar3 = (uint *)malloc((ulong)uVar5);
      if (puVar3 == (uint *)0x0) {
        kVar6 = KTX_OUT_OF_MEMORY;
      }
      else {
        *pKvdLen = uVar5;
        *ppKvd = (uchar *)puVar3;
        kVar6 = KTX_SUCCESS;
        while (pkVar1 = *pHead, pkVar1 != (ktxHashList)0x0) {
          uVar5 = pkVar1->valueLen + pkVar1->keyLen;
          *puVar3 = uVar5;
          memcpy(puVar3 + 1,pkVar1->key,(ulong)pkVar1->keyLen);
          puVar7 = (uchar *)((long)puVar3 + (ulong)pkVar1->keyLen + 4);
          if ((ulong)pkVar1->valueLen == 0) {
            uVar4 = 0;
            auVar10 = extraout_var;
          }
          else {
            memcpy(puVar7,pkVar1->value,(ulong)pkVar1->valueLen);
            uVar4 = (ulong)pkVar1->valueLen;
            auVar10 = extraout_var_00;
          }
          puVar7 = puVar7 + uVar4;
          fVar8 = (float)uVar5;
          auVar11._4_4_ = auVar10._0_4_;
          auVar11._0_4_ = fVar8;
          auVar11._8_4_ = auVar10._4_4_;
          auVar11._12_4_ = auVar10._8_4_;
          auVar12._4_12_ = auVar11._4_12_;
          auVar12._0_4_ = fVar8 * 0.25;
          auVar9 = roundss(auVar12,auVar12,10);
          __n = (size_t)(int)(long)(auVar9._0_4_ * 4.0 - fVar8);
          memcpy(puVar7,padding,__n);
          puVar3 = (uint *)(puVar7 + __n);
          pHead = (ktxHashList *)&(pkVar1->hh).next;
        }
      }
    }
  }
  return kVar6;
}

Assistant:

KTX_error_code
ktxHashList_Serialize(ktxHashList* pHead,
                      unsigned int* pKvdLen, unsigned char** ppKvd)
{

    if (pHead && pKvdLen && ppKvd) {
        ktxKVListEntry* kv;
        unsigned int bytesOfKeyValueData = 0;
        unsigned int keyValueLen;
        unsigned char* sd;
        char padding[4] = {0, 0, 0, 0};

        for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
            /* sizeof(sd) is to make space to write keyAndValueByteSize */
            keyValueLen = kv->keyLen + kv->valueLen + sizeof(ktx_uint32_t);
            /* Add valuePadding */
            keyValueLen = _KTX_PAD4(keyValueLen);
            bytesOfKeyValueData += keyValueLen;
        }

        if (bytesOfKeyValueData == 0) {
            *pKvdLen = 0;
            *ppKvd = NULL;
        } else {
            sd = malloc(bytesOfKeyValueData);
            if (!sd)
                return KTX_OUT_OF_MEMORY;

            *pKvdLen = bytesOfKeyValueData;
            *ppKvd = sd;

            for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
                int padLen;

                keyValueLen = kv->keyLen + kv->valueLen;
                *(ktx_uint32_t*)sd = keyValueLen;
                sd += sizeof(ktx_uint32_t);
                memcpy(sd, kv->key, kv->keyLen);
                sd += kv->keyLen;
                if (kv->valueLen > 0)
                    memcpy(sd, kv->value, kv->valueLen);
                sd += kv->valueLen;
                padLen = _KTX_PAD4_LEN(keyValueLen);
                memcpy(sd, padding, padLen);
                sd += padLen;
            }
        }
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}